

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManCoSuppSizeMax(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int nSuppMax;
  int iVar3;
  int i;
  int v;
  
  iVar3 = 1;
  v = 0;
  while( true ) {
    if (p->vCos->nSize <= v) {
      return iVar3;
    }
    pGVar1 = Gia_ManCo(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    pVVar2 = Vec_WecEntry(vSupps,v);
    if (iVar3 <= pVVar2->nSize) {
      iVar3 = pVVar2->nSize;
    }
    v = v + 1;
  }
  return iVar3;
}

Assistant:

int Gia_ManCoSuppSizeMax( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vSuppOne;
    int i, nSuppMax = 1;
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        nSuppMax = Abc_MaxInt( nSuppMax, Vec_IntSize(vSuppOne) );
    }
    return nSuppMax;
}